

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O3

void __thiscall
duckdb::StringValueResult::HandleUnicodeError
          (StringValueResult *this,idx_t col_idx,LinePosition *error_position)

{
  idx_t iVar1;
  idx_t iVar2;
  CSVReaderOptions *pCVar3;
  idx_t iVar4;
  byte reconstruct_line;
  idx_t iVar5;
  ulong uVar6;
  string *psVar7;
  LinesPerBoundary error_info;
  LinesPerBoundary error_info_00;
  string *current_path;
  bool first_nl;
  CSVReaderOptions *local_118;
  LinesPerBoundary lines_per_batch;
  optional_idx local_f0;
  optional_idx local_e8;
  string borked_line;
  CSVError csv_error;
  
  first_nl = false;
  if ((this->super_ScannerResult).result_size == 1) {
    reconstruct_line = false;
  }
  else {
    pCVar3 = ((this->super_ScannerResult).state_machine)->options;
    reconstruct_line = true;
    if ((pCVar3->store_rejects).value == false) {
      reconstruct_line = (pCVar3->ignore_errors).value ^ 1;
    }
  }
  FullLinePosition::
  ReconstructCurrentLine<std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
            (&borked_line,&this->current_line_position,&first_nl,&this->buffer_handles,
             (bool)reconstruct_line);
  LinesPerBoundary::LinesPerBoundary
            (&lines_per_batch,(this->iterator->boundary).boundary_idx,*this->lines_read);
  iVar1 = (this->current_line_position).begin.buffer_pos;
  iVar2 = (this->current_line_position).begin.buffer_idx;
  iVar5 = error_position->buffer_idx;
  local_118 = (CSVReaderOptions *)col_idx;
  if ((error_position->buffer_idx == iVar2 && iVar1 == error_position->buffer_pos) &&
     (iVar5 = iVar2, (this->current_line_position).begin.buffer_size == error_position->buffer_size)
     ) {
    pCVar3 = ((this->super_ScannerResult).state_machine)->options;
    psVar7 = (string *)(iVar1 + first_nl + this->requested_size * iVar2);
    current_path = (string *)0x17dbe0f;
    optional_idx::optional_idx(&local_e8,(idx_t)psVar7);
    error_info.lines_in_batch = (idx_t)&borked_line;
    error_info.boundary_idx = lines_per_batch.lines_in_batch;
    CSVError::InvalidUTF8
              (&csv_error,(CSVError *)pCVar3,local_118,lines_per_batch.boundary_idx,error_info,
               psVar7,local_e8.index,(optional_idx)&this->path,current_path);
    CSVErrorHandler::Error(this->error_handler,&csv_error,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)csv_error.csv_row._M_dataplus._M_p != &csv_error.csv_row.field_2) {
      operator_delete(csv_error.csv_row._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)csv_error.full_error_message._M_dataplus._M_p != &csv_error.full_error_message.field_2) {
      operator_delete(csv_error.full_error_message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)csv_error.error_message._M_dataplus._M_p == &csv_error.error_message.field_2)
    goto LAB_017dbf6e;
  }
  else {
    iVar4 = this->requested_size;
    pCVar3 = ((this->super_ScannerResult).state_machine)->options;
    uVar6 = (ulong)first_nl;
    psVar7 = (string *)0x17dbed8;
    optional_idx::optional_idx(&local_f0,iVar5 * iVar4 + error_position->buffer_pos);
    error_info_00.lines_in_batch = (idx_t)&borked_line;
    error_info_00.boundary_idx = lines_per_batch.lines_in_batch;
    CSVError::InvalidUTF8
              (&csv_error,(CSVError *)pCVar3,local_118,lines_per_batch.boundary_idx,error_info_00,
               (string *)(iVar2 * iVar4 + iVar1 + uVar6),local_f0.index,(optional_idx)&this->path,
               psVar7);
    CSVErrorHandler::Error(this->error_handler,&csv_error,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)csv_error.csv_row._M_dataplus._M_p != &csv_error.csv_row.field_2) {
      operator_delete(csv_error.csv_row._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)csv_error.full_error_message._M_dataplus._M_p != &csv_error.full_error_message.field_2) {
      operator_delete(csv_error.full_error_message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)csv_error.error_message._M_dataplus._M_p == &csv_error.error_message.field_2)
    goto LAB_017dbf6e;
  }
  operator_delete(csv_error.error_message._M_dataplus._M_p);
LAB_017dbf6e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)borked_line._M_dataplus._M_p != &borked_line.field_2) {
    operator_delete(borked_line._M_dataplus._M_p);
  }
  return;
}

Assistant:

void StringValueResult::HandleUnicodeError(idx_t col_idx, LinePosition &error_position) {

	bool first_nl = false;
	auto borked_line = current_line_position.ReconstructCurrentLine(first_nl, buffer_handles, PrintErrorLine());
	LinesPerBoundary lines_per_batch(iterator.GetBoundaryIdx(), lines_read);
	if (current_line_position.begin == error_position) {
		auto csv_error = CSVError::InvalidUTF8(state_machine.options, col_idx, lines_per_batch, borked_line,
		                                       current_line_position.begin.GetGlobalPosition(requested_size, first_nl),
		                                       error_position.GetGlobalPosition(requested_size, first_nl), path);
		error_handler.Error(csv_error, true);
	} else {
		auto csv_error = CSVError::InvalidUTF8(state_machine.options, col_idx, lines_per_batch, borked_line,
		                                       current_line_position.begin.GetGlobalPosition(requested_size, first_nl),
		                                       error_position.GetGlobalPosition(requested_size), path);
		error_handler.Error(csv_error, true);
	}
}